

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void __thiscall pg::FPISolver::runSeq(FPISolver *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 node;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  ostream *poVar14;
  bool bVar15;
  _label_vertex _Var16;
  int local_11c;
  _label_vertex local_b8;
  Game *local_a8;
  int local_a0;
  _label_vertex local_98;
  undefined1 local_88 [24];
  undefined1 local_70 [4];
  int v_2;
  undefined1 local_60 [28];
  int winner;
  int v_1;
  int p;
  uint local_30;
  int local_2c;
  int p_1;
  int v;
  int *p_len;
  int *p_start;
  FPISolver *pFStack_10;
  int d;
  FPISolver *this_local;
  
  pFStack_10 = this;
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->distraction,sVar9);
  uVar10 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar10;
  uVar10 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar11 = (int *)operator_new__(uVar10);
  this->strategy = piVar11;
  uVar10 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  uVar10 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar11 = (int *)operator_new__(uVar10);
  this->frozen = piVar11;
  piVar11 = this->frozen;
  lVar12 = Solver::nodecount(&this->super_Solver);
  memset(piVar11,0,lVar12 << 2);
  lVar12 = Solver::nodecount(&this->super_Solver);
  p_start._4_4_ = Solver::priority(&this->super_Solver,(int)lVar12 + -1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(p_start._4_4_ + 1);
  uVar10 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  p_len = (int *)operator_new__(uVar10);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(p_start._4_4_ + 1);
  uVar10 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  _p_1 = operator_new__(uVar10);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->parity,sVar9);
  local_2c = 0;
  for (local_30 = 0; (int)local_30 <= p_start._4_4_; local_30 = local_30 + 1) {
    uVar6 = Solver::priority(&this->super_Solver,local_2c);
    if (uVar6 == local_30) {
      p_len[(int)local_30] = local_2c;
      while( true ) {
        lVar12 = (long)local_2c;
        lVar13 = Solver::nodecount(&this->super_Solver);
        bVar15 = false;
        if (lVar12 < lVar13) {
          uVar6 = Solver::priority(&this->super_Solver,local_2c);
          bVar15 = uVar6 == local_30;
        }
        if (!bVar15) break;
        uVar6 = local_30 & 1;
        bitset::operator[]((bitset *)&v_1,(size_t)&this->parity);
        bitset::reference::operator=((reference *)&v_1,uVar6 != 0);
        local_2c = local_2c + 1;
      }
      *(int *)((long)_p_1 + (long)(int)local_30 * 4) = local_2c - p_len[(int)local_30];
    }
    else {
      p_len[(int)local_30] = -1;
      *(undefined4 *)((long)_p_1 + (long)(int)local_30 * 4) = 0;
    }
  }
  this->iterations = 1;
  winner = 0;
  while (winner <= p_start._4_4_) {
    if ((*(int *)((long)_p_1 + (long)winner * 4) == 0) ||
       (iVar7 = updateBlock(this,p_len[winner],*(int *)((long)_p_1 + (long)winner * 4)), iVar7 == 0)
       ) {
      winner = winner + 1;
    }
    else {
      if (winner != 0) {
        freezeThawReset(this,0,p_len[winner],winner);
        winner = 0;
      }
      this->iterations = this->iterations + 1;
      if (1 < (this->super_Solver).trace) {
        poVar14 = std::operator<<((this->super_Solver).logger,
                                  "restarting after finding distractions");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  for (local_60._24_4_ = 0; lVar12 = (long)(int)local_60._24_4_,
      lVar13 = Solver::nodecount(&this->super_Solver), lVar12 < lVar13;
      local_60._24_4_ = local_60._24_4_ + 1) {
    bVar15 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_60._24_4_);
    if (!bVar15) {
      bitset::operator[]((bitset *)local_60,(size_t)&this->parity);
      bVar15 = bitset::reference::operator_cast_to_bool((reference *)local_60);
      bitset::operator[]((bitset *)local_70,(size_t)&this->distraction);
      bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_70);
      node = local_60._24_4_;
      uVar6 = (uint)(bVar15 != bVar5);
      local_60._20_4_ = uVar6;
      uVar8 = Solver::owner(&this->super_Solver,local_60._24_4_);
      if (uVar6 == uVar8) {
        local_11c = this->strategy[(int)local_60._24_4_];
      }
      else {
        local_11c = -1;
      }
      Solver::solve(&this->super_Solver,node,uVar6,local_11c);
    }
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->frozen != (int *)0x0) {
    operator_delete__(this->frozen);
  }
  if (p_len != (int *)0x0) {
    operator_delete__(p_len);
  }
  if (_p_1 != (void *)0x0) {
    operator_delete__(_p_1);
  }
  poVar14 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
  poVar14 = std::operator<<(poVar14," iterations.");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  if ((this->super_Solver).trace != 0) {
    std::operator<<((this->super_Solver).logger,"Distractions:\n");
    for (local_88._20_4_ = 0; lVar12 = (long)(int)local_88._20_4_,
        lVar13 = Solver::nodecount(&this->super_Solver), lVar12 < lVar13;
        local_88._20_4_ = local_88._20_4_ + 1) {
      bitset::operator[]((bitset *)local_88,(size_t)&this->distraction);
      bVar15 = bitset::reference::operator_cast_to_bool((reference *)local_88);
      if (bVar15) {
        poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1;38:5:124m");
        _Var16 = Solver::label_vertex(&this->super_Solver,local_88._20_4_);
        local_a8 = _Var16.g;
        local_a0 = _Var16.v;
        local_98.g = local_a8;
        local_98.v = local_a0;
        poVar14 = operator<<(poVar14,&local_98);
        std::operator<<(poVar14,"\x1b[m");
      }
      else {
        poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1;38:5:34m");
        _Var16 = Solver::label_vertex(&this->super_Solver,local_88._20_4_);
        local_b8.g = _Var16.g;
        local_b8.v = _Var16.v;
        poVar14 = operator<<(poVar14,&local_b8);
        std::operator<<(poVar14,"\x1b[m");
      }
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void
FPISolver::runSeq()
{
    /**
     * Allocate and initialize data structures
     */
    distraction.resize(nodecount());
    strategy = new int[nodecount()]; // the current strategy for winning the game
    frozen = new int[nodecount()]; // records for every vertex at which level it is frozen (or 0 if not frozen)
    memset(frozen, 0, sizeof(int[nodecount()])); // initially no vertex is frozen (we don't freeze at level 0)

    int d = priority(nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];
    parity.resize(nodecount());

    /**
     * Initialize p_start, p_len, parity
     */
    int v=0;
    for (int p=0; p<=d; p++) {
        if (priority(v) == p) {
            p_start[p] = v;
            while (v < nodecount() and priority(v) == p) {
                parity[v] = p&1;
                v++;
            }
            p_len[p] = v - p_start[p];
        } else {
            p_start[p] = -1;
            p_len[p] = 0;
        }
    }

    /**
     * The main loop
     */
    iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0 or updateBlock(p_start[p], p_len[p]) == 0) {
            p++;
            continue;
        } 

        if (p != 0) {
            // actually we don't freeze at priority 0 :-)
            freezeThawReset(0, p_start[p] /* +p_len[p] */, p);
            p = 0;
        }

        iterations++;
#ifndef NDEBUG
        if (trace >= 2) logger << "restarting after finding distractions" << std::endl;
#endif
    }

    /**
     * Done, now tell Oink the solution
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    /**
     * Free allocated data structures
     */
    delete[] strategy;
    delete[] frozen;
    delete[] p_start;
    delete[] p_len;

    logger << "solved with " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    if (trace) {
        logger << "Distractions:\n";
        for (int v=0; v<nodecount(); v++) {
            if (distraction[v]) logger << "\033[1;38:5:124m" << label_vertex(v) << "\033[m";
            else logger << "\033[1;38:5:34m" << label_vertex(v) << "\033[m";
            logger << std::endl;
        }
    }
#endif
}